

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdio.cpp
# Opt level: O0

SQRESULT sqstd_loadfile(HSQUIRRELVM v,SQChar *filename,SQBool printerror)

{
  SQFILE pvVar1;
  SQInteger SVar2;
  long lVar3;
  SQRESULT SVar4;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  IOBuffer buffer;
  SQLEXREADFUNC func;
  uchar uc;
  unsigned_short us;
  SQInteger ret;
  SQFILE file;
  SQChar *in_stack_fffffffffffff798;
  undefined4 in_stack_fffffffffffff7a0;
  undefined4 in_stack_fffffffffffff7a4;
  SQInteger in_stack_fffffffffffff7a8;
  void *in_stack_fffffffffffff7b0;
  SQFILE in_stack_fffffffffffff7b8;
  code *local_40;
  char local_33;
  short local_32;
  
  pvVar1 = sqstd_fopen((SQChar *)CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0),
                       in_stack_fffffffffffff798);
  local_40 = _io_file_lexfeed_PLAIN;
  if (pvVar1 == (SQFILE)0x0) {
    SVar4 = sq_throwerror(in_RDI,"cannot open the file");
    return SVar4;
  }
  SVar2 = sqstd_fread(in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8,
                      CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0),
                      in_stack_fffffffffffff798);
  if (SVar2 != 2) {
    local_32 = 0;
  }
  if (local_32 == -0x506) {
    sqstd_fseek(in_stack_fffffffffffff7b8,(SQInteger)in_stack_fffffffffffff7b0,
                in_stack_fffffffffffff7a8);
    lVar3 = sq_readclosure(in_RDI,file_read,pvVar1);
    if (-1 < lVar3) {
      sqstd_fclose((SQFILE)0x108bf9);
      return 0;
    }
  }
  else {
    if (local_32 == -0x4411) {
      SVar2 = sqstd_fread(in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8,
                          (ulong)CONCAT24(0xbbef,in_stack_fffffffffffff7a0),
                          in_stack_fffffffffffff798);
      if (SVar2 == 0) {
        sqstd_fclose((SQFILE)0x108c9a);
        SVar4 = sq_throwerror(in_RDI,"io error");
        return SVar4;
      }
      if (local_33 != -0x41) {
        sqstd_fclose((SQFILE)0x108cd7);
        SVar4 = sq_throwerror(in_RDI,"Unrecognized encoding");
        return SVar4;
      }
      local_40 = _io_file_lexfeed_PLAIN;
    }
    else if (local_32 == -0x101) {
      local_40 = _io_file_lexfeed_UCS2_LE;
    }
    else if (local_32 == -2) {
      local_40 = _io_file_lexfeed_UCS2_BE;
    }
    else {
      sqstd_fseek(in_stack_fffffffffffff7b8,(SQInteger)in_stack_fffffffffffff7b0,
                  in_stack_fffffffffffff7a8);
    }
    lVar3 = sq_compile(in_RDI,local_40,&stack0xfffffffffffff7a8,in_RSI,in_RDX);
    if (-1 < lVar3) {
      sqstd_fclose((SQFILE)0x108d84);
      return 0;
    }
  }
  sqstd_fclose((SQFILE)0x108da1);
  return -1;
}

Assistant:

SQRESULT sqstd_loadfile(HSQUIRRELVM v,const SQChar *filename,SQBool printerror)
{
    SQFILE file = sqstd_fopen(filename,_SC("rb"));

    SQInteger ret;
    unsigned short us;
    unsigned char uc;
    SQLEXREADFUNC func = _io_file_lexfeed_PLAIN;
    if(file){
        ret = sqstd_fread(&us,1,2,file);
        if(ret != 2) {
            //probably an empty file
            us = 0;
        }
        if(us == SQ_BYTECODE_STREAM_TAG) { //BYTECODE
            sqstd_fseek(file,0,SQ_SEEK_SET);
            if(SQ_SUCCEEDED(sq_readclosure(v,file_read,file))) {
                sqstd_fclose(file);
                return SQ_OK;
            }
        }
        else { //SCRIPT

            switch(us)
            {
                //gotta swap the next 2 lines on BIG endian machines
                case 0xFFFE: func = _io_file_lexfeed_UCS2_BE; break;//UTF-16 little endian;
                case 0xFEFF: func = _io_file_lexfeed_UCS2_LE; break;//UTF-16 big endian;
                case 0xBBEF:
                    if(sqstd_fread(&uc,1,sizeof(uc),file) == 0) {
                        sqstd_fclose(file);
                        return sq_throwerror(v,_SC("io error"));
                    }
                    if(uc != 0xBF) {
                        sqstd_fclose(file);
                        return sq_throwerror(v,_SC("Unrecognized encoding"));
                    }
#ifdef SQUNICODE
                    func = _io_file_lexfeed_UTF8;
#else
                    func = _io_file_lexfeed_PLAIN;
#endif
                    break;//UTF-8 ;
                default: sqstd_fseek(file,0,SQ_SEEK_SET); break; // ascii
            }
            IOBuffer buffer;
            buffer.ptr = 0;
            buffer.size = 0;
            buffer.file = file;
            if(SQ_SUCCEEDED(sq_compile(v,func,&buffer,filename,printerror))){
                sqstd_fclose(file);
                return SQ_OK;
            }
        }
        sqstd_fclose(file);
        return SQ_ERROR;
    }
    return sq_throwerror(v,_SC("cannot open the file"));
}